

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qaccessiblewidgets.cpp
# Opt level: O0

QString * __thiscall
QAccessibleTextWidget::textBeforeOffset
          (QAccessibleTextWidget *this,int offset,TextBoundaryType boundaryType,int *startOffset,
          int *endOffset)

{
  TextBoundaryType in_ECX;
  MoveMode in_EDX;
  long *in_RSI;
  int iVar1;
  QString *in_RDI;
  int *in_R8;
  int *in_R9;
  long in_FS_OFFSET;
  pair<int,_int> boundaries;
  QTextCursor cursor;
  pair<int,_int> local_20;
  pair<int,_int> local_18;
  undefined1 *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_10 = &DAT_aaaaaaaaaaaaaaaa;
  (**(code **)(*in_RSI + 0x158))();
  iVar1 = (int)(QTextCursor *)&local_10;
  QTextCursor::setPosition(iVar1,in_EDX);
  local_18 = (pair<int,_int>)&DAT_aaaaaaaaaaaaaaaa;
  local_18 = (pair<int,_int>)
             QAccessible::qAccessibleTextBoundaryHelper((QTextCursor *)&local_10,in_ECX);
  QTextCursor::setPosition(iVar1,local_18.first - KeepAnchor);
  local_20 = (pair<int,_int>)
             QAccessible::qAccessibleTextBoundaryHelper((QTextCursor *)&local_10,in_ECX);
  std::pair<int,_int>::operator=(&local_18,&local_20);
  *in_R8 = local_18.first;
  *in_R9 = local_18.second;
  (**(code **)(*in_RSI + 0xf8))(in_RDI,in_RSI,(ulong)local_18 & 0xffffffff,local_18.second);
  QTextCursor::~QTextCursor((QTextCursor *)&local_10);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

QString QAccessibleTextWidget::textBeforeOffset(int offset, QAccessible::TextBoundaryType boundaryType,
                                                int *startOffset, int *endOffset) const
{
    Q_ASSERT(startOffset);
    Q_ASSERT(endOffset);

    QTextCursor cursor = textCursor();
    cursor.setPosition(offset);
    std::pair<int, int> boundaries = QAccessible::qAccessibleTextBoundaryHelper(cursor, boundaryType);
    cursor.setPosition(boundaries.first - 1);
    boundaries = QAccessible::qAccessibleTextBoundaryHelper(cursor, boundaryType);

    *startOffset = boundaries.first;
    *endOffset = boundaries.second;

    return text(boundaries.first, boundaries.second);
 }